

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

Value * __thiscall Json::Value::operator[](Value *this,ArrayIndex index)

{
  iterator iVar1;
  undefined1 *puVar2;
  CZString key;
  string local_1a0;
  key_type local_180 [23];
  
  if (this->field_0x8 == '\0') {
    puVar2 = kNull;
  }
  else {
    if (this->field_0x8 != '\x06') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_180);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_180,
                 "in Json::Value::operator[](ArrayIndex)const: requires arrayValue",0x40);
      std::__cxx11::stringbuf::str();
      throwLogicError(&local_1a0);
    }
    local_180[0].cstr_ = (char *)0x0;
    local_180[0].field_1.index_ = index;
    iVar1 = std::
            _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
            ::find(&((this->value_).map_)->_M_t,local_180);
    puVar2 = kNull;
    if ((_Rb_tree_header *)iVar1._M_node !=
        &(((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header) {
      puVar2 = (undefined1 *)&iVar1._M_node[1]._M_left;
    }
    if ((local_180[0].cstr_ != (char *)0x0) && ((local_180[0].field_1.index_ & 3) == 1)) {
      free(local_180[0].cstr_);
    }
  }
  return (Value *)puVar2;
}

Assistant:

const Value& Value::operator[](ArrayIndex index) const {
  JSON_ASSERT_MESSAGE(
      type_ == nullValue || type_ == arrayValue,
      "in Json::Value::operator[](ArrayIndex)const: requires arrayValue");
  if (type_ == nullValue)
    return nullRef;
  CZString key(index);
  ObjectValues::const_iterator it = value_.map_->find(key);
  if (it == value_.map_->end())
    return nullRef;
  return (*it).second;
}